

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase * CreateFunctionContextType(ExpressionContext *ctx,SynBase *source,InplaceStr functionName)

{
  Allocator *allocator;
  ScopeData *scope;
  IntrusiveList<MatchData> generics;
  InplaceStr functionName_00;
  char *source_00;
  uint index;
  TypeClass *this;
  IntrusiveList<MatchData> local_c8;
  char *local_b8;
  char *pcStack_b0;
  SynIdentifier local_a0;
  TypeClass *local_50;
  TypeClass *contextClassType;
  char *pcStack_40;
  undefined1 auStack_38 [8];
  InplaceStr functionContextName;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr functionName_local;
  
  pcStack_40 = functionName.end;
  contextClassType = (TypeClass *)functionName.begin;
  functionContextName.end = (char *)source;
  index = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
  functionName_00.end = pcStack_40;
  functionName_00.begin = (char *)contextClassType;
  _auStack_38 = GetFunctionContextTypeName(ctx,functionName_00,index);
  this = ExpressionContext::get<TypeClass>(ctx);
  allocator = ctx->allocator;
  local_b8 = (char *)auStack_38;
  pcStack_b0 = functionContextName.begin;
  SynIdentifier::SynIdentifier(&local_a0,_auStack_38);
  source_00 = functionContextName.end;
  scope = ctx->scope;
  IntrusiveList<MatchData>::IntrusiveList(&local_c8);
  generics.tail = local_c8.tail;
  generics.head = local_c8.head;
  TypeClass::TypeClass
            (this,allocator,&local_a0,(SynBase *)source_00,scope,(TypeGenericClassProto *)0x0,
             generics,false,(TypeClass *)0x0);
  SynIdentifier::~SynIdentifier(&local_a0);
  this->isInternal = true;
  local_50 = this;
  ExpressionContext::AddType(ctx,(TypeBase *)this);
  ExpressionContext::PushScope(ctx,(TypeBase *)local_50);
  (local_50->super_TypeStruct).typeScope = ctx->scope;
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  local_50->completed = true;
  return (TypeBase *)local_50;
}

Assistant:

TypeBase* CreateFunctionContextType(ExpressionContext &ctx, SynBase *source, InplaceStr functionName)
{
	InplaceStr functionContextName = GetFunctionContextTypeName(ctx, functionName, ctx.functions.size());

	TypeClass *contextClassType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(functionContextName), source, ctx.scope, NULL, IntrusiveList<MatchData>(), false, NULL);

	contextClassType->isInternal = true;

	ctx.AddType(contextClassType);

	ctx.PushScope(contextClassType);

	contextClassType->typeScope = ctx.scope;

	ctx.PopScope(SCOPE_TYPE);

	contextClassType->completed = true;

	return contextClassType;
}